

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O3

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  ulong uVar7;
  byte bVar8;
  
  puVar6 = *p;
  iVar4 = -0x6c;
  iVar5 = iVar4;
  if (start <= puVar6) {
    uVar1 = bits + 7;
    uVar7 = uVar1 >> 3;
    if (uVar7 < (ulong)((long)puVar6 - (long)start)) {
      bVar8 = ((byte)uVar1 & 0xf8) - (char)bits;
      if (7 < uVar1) {
        bVar2 = buf[uVar7 - 1];
        *p = puVar6 + -1;
        puVar6[-1] = (byte)(-1 << (bVar8 & 0x1f)) & bVar2;
        puVar6 = *p;
        *p = puVar6 + (1 - uVar7);
        memcpy(puVar6 + (1 - uVar7),buf,uVar7 - 1);
        puVar6 = *p;
      }
      *p = puVar6 + -1;
      puVar6[-1] = bVar8;
      iVar3 = mbedtls_asn1_write_len(p,start,uVar7 + 1);
      iVar5 = iVar3;
      if ((-1 < iVar3) &&
         (puVar6 = *p, iVar5 = iVar4, puVar6 != start && -1 < (long)puVar6 - (long)start)) {
        *p = puVar6 + -1;
        puVar6[-1] = '\x03';
        iVar5 = (int)(uVar7 + 1) + iVar3 + 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_asn1_write_bitstring(unsigned char **p, const unsigned char *start,
                                 const unsigned char *buf, size_t bits)
{
    size_t len = 0;
    size_t unused_bits, byte_len;

    byte_len = (bits + 7) / 8;
    unused_bits = (byte_len * 8) - bits;

    if (*p < start || (size_t) (*p - start) < byte_len + 1) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = byte_len + 1;

    /* Write the bitstring. Ensure the unused bits are zeroed */
    if (byte_len > 0) {
        byte_len--;
        *--(*p) = buf[byte_len] & ~((0x1 << unused_bits) - 1);
        (*p) -= byte_len;
        memcpy(*p, buf, byte_len);
    }

    /* Write unused bits */
    *--(*p) = (unsigned char) unused_bits;

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_BIT_STRING);
}